

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
          (BindDirectiveSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token bind,NameSyntax *target,BindTargetListSyntax *targetInstances,
          MemberSyntax *instantiation)

{
  undefined8 uVar1;
  
  uVar1 = bind._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,BindDirective,attributes);
  (this->bind).kind = (short)uVar1;
  (this->bind).field_0x2 = (char)((ulong)uVar1 >> 0x10);
  (this->bind).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
  (this->bind).rawLen = (int)((ulong)uVar1 >> 0x20);
  (this->bind).info = bind.info;
  (this->target).ptr = target;
  this->targetInstances = targetInstances;
  (this->instantiation).ptr = instantiation;
  (target->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (targetInstances != (BindTargetListSyntax *)0x0) {
    (targetInstances->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (instantiation->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

BindDirectiveSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token bind, NameSyntax& target, BindTargetListSyntax* targetInstances, MemberSyntax& instantiation) :
        MemberSyntax(SyntaxKind::BindDirective, attributes), bind(bind), target(&target), targetInstances(targetInstances), instantiation(&instantiation) {
        this->target->parent = this;
        if (this->targetInstances) this->targetInstances->parent = this;
        this->instantiation->parent = this;
    }